

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

LY_ERR lyd_validate_node_when
                 (lyd_node *tree,lyd_node *node,lysc_node *schema,uint32_t xpath_options,
                 lysc_when **disabled)

{
  lysc_when *plVar1;
  LY_ERR LVar2;
  lysc_when **pplVar3;
  bool bVar4;
  ly_ctx *local_120;
  lysc_when *local_118;
  LY_ERR ret__;
  lysc_when **when_list;
  lysc_when *when;
  uint64_t u;
  lyxp_set xp_set;
  lyd_node *local_50;
  lyd_node *ctx_node;
  LY_ERR r;
  lysc_when **disabled_local;
  lysc_node *plStack_30;
  uint32_t xpath_options_local;
  lysc_node *schema_local;
  lyd_node *node_local;
  lyd_node *tree_local;
  
  if ((node->schema != (lysc_node *)0x0) && (node->schema != schema)) {
    __assert_fail("!node->schema || (node->schema == schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                  ,0xfd,
                  "LY_ERR lyd_validate_node_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, const struct lysc_when **)"
                 );
  }
  *disabled = (lysc_when *)0x0;
  plStack_30 = schema;
  do {
    pplVar3 = lysc_node_when(plStack_30);
    when = (lysc_when *)0x0;
    while( true ) {
      if (pplVar3 == (lysc_when **)0x0) {
        local_118 = (lysc_when *)0x0;
      }
      else {
        local_118 = pplVar3[-1];
      }
      if (local_118 <= when) break;
      plVar1 = pplVar3[(long)when];
      local_50 = node;
      if (plVar1->context != plStack_30) {
        if (((plVar1->context != (lysc_node *)0x0) || (node->parent != (lyd_node_inner *)0x0)) &&
           (plVar1->context != (node->parent->field_0).node.schema)) {
          __assert_fail("(!when->context && !node->parent) || (when->context == node->parent->schema)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/validation.c"
                        ,0x10c,
                        "LY_ERR lyd_validate_node_when(const struct lyd_node *, const struct lyd_node *, const struct lysc_node *, uint32_t, const struct lysc_when **)"
                       );
        }
        local_50 = lyd_parent(node);
      }
      memset(&u,0,0x90);
      if (node->schema == (lysc_node *)0x0) {
        local_120 = (ly_ctx *)node[2].schema;
      }
      else {
        local_120 = node->schema->module->ctx;
      }
      LVar2 = lyxp_eval(local_120,plVar1->cond,plStack_30->module,LY_VALUE_SCHEMA_RESOLVED,
                        plVar1->prefixes,local_50,local_50,tree,(lyxp_var *)0x0,(lyxp_set *)&u,
                        xpath_options | 2);
      lyxp_set_cast((lyxp_set *)&u,LYXP_SET_BOOLEAN);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (xp_set._8_1_ == '\0') {
        *disabled = plVar1;
        return LY_SUCCESS;
      }
      when = (lysc_when *)((long)&when->cond + 1);
    }
    plStack_30 = plStack_30->parent;
    bVar4 = false;
    if (plStack_30 != (lysc_node *)0x0) {
      bVar4 = (plStack_30->nodetype & 0x82) != 0;
    }
    if (!bVar4) {
      return LY_SUCCESS;
    }
  } while( true );
}

Assistant:

static LY_ERR
lyd_validate_node_when(const struct lyd_node *tree, const struct lyd_node *node, const struct lysc_node *schema,
        uint32_t xpath_options, const struct lysc_when **disabled)
{
    LY_ERR r;
    const struct lyd_node *ctx_node;
    struct lyxp_set xp_set;
    LY_ARRAY_COUNT_TYPE u;

    assert(!node->schema || (node->schema == schema));

    *disabled = NULL;

    do {
        const struct lysc_when *when;
        struct lysc_when **when_list = lysc_node_when(schema);

        LY_ARRAY_FOR(when_list, u) {
            when = when_list[u];

            /* get context node */
            if (when->context == schema) {
                ctx_node = node;
            } else {
                assert((!when->context && !node->parent) || (when->context == node->parent->schema));
                ctx_node = lyd_parent(node);
            }

            /* evaluate when */
            memset(&xp_set, 0, sizeof xp_set);
            r = lyxp_eval(LYD_CTX(node), when->cond, schema->module, LY_VALUE_SCHEMA_RESOLVED, when->prefixes,
                    ctx_node, ctx_node, tree, NULL, &xp_set, LYXP_SCHEMA | xpath_options);
            lyxp_set_cast(&xp_set, LYXP_SET_BOOLEAN);

            /* return error or LY_EINCOMPLETE for dependant unresolved when */
            LY_CHECK_RET(r);

            if (!xp_set.val.bln) {
                /* false when */
                *disabled = when;
                return LY_SUCCESS;
            }
        }

        schema = schema->parent;
    } while (schema && (schema->nodetype & (LYS_CASE | LYS_CHOICE)));

    return LY_SUCCESS;
}